

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

void __thiscall QThreadPool::setServiceLevel(QThreadPool *this,QualityOfService serviceLevel)

{
  QThreadPoolPrivate *this_00;
  QualityOfService in_ESI;
  long in_FS_OFFSET;
  QThreadPoolPrivate *d;
  QMutexLocker<QMutex> locker;
  QBasicAtomicPointer<QMutexPrivate> local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QThreadPool *)0x6cc9a9);
  local_18._q_value._M_b._M_p = (AtomicType)&DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)this_00,(QMutex *)&local_18);
  this_00->serviceLevel = in_ESI;
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPool::setServiceLevel(QThread::QualityOfService serviceLevel)
{
    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    d->serviceLevel = serviceLevel;
}